

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O3

void __thiscall Assimp::ObjExporter::WriteGeometryFile(ObjExporter *this,bool noMtl)

{
  bool bVar1;
  pointer pvVar2;
  pointer paVar3;
  pointer pFVar4;
  pointer pFVar5;
  ostream *poVar6;
  vertexData *v_1;
  pointer paVar7;
  pointer pFVar8;
  vertexData *v;
  pointer pvVar9;
  undefined7 in_register_00000031;
  FaceVertex *fv;
  pointer pFVar10;
  pointer pMVar11;
  aiMatrix4x4 mBase;
  char local_85;
  int local_84;
  pointer local_80;
  pointer local_78;
  undefined1 local_70 [32];
  undefined8 uStack_50;
  float local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  float local_34;
  
  WriteHeader(this,&this->mOutput);
  local_84 = (int)CONCAT71(in_register_00000031,noMtl);
  if (local_84 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"mtllib ",7);
    GetMaterialLibName_abi_cxx11_((string *)local_70,this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this,(char *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        CONCAT44(local_70._12_4_,local_70._8_4_));
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_));
    }
  }
  local_70._0_4_ = 1.0;
  local_70._4_4_ = 0.0;
  local_70._8_4_ = 0.0;
  local_70._12_4_ = 0.0;
  local_70._16_4_ = 0;
  local_70._20_4_ = 0x3f800000;
  local_70._24_8_ = 0;
  uStack_50._0_4_ = 0.0;
  uStack_50._4_4_ = 0.0;
  local_48 = 1.0;
  local_44._0_4_ = 0.0;
  local_44._4_4_ = 0.0;
  uStack_3c._0_4_ = 0.0;
  uStack_3c._4_4_ = 0.0;
  local_34 = 1.0;
  AddNode(this,this->pScene->mRootNode,(aiMatrix4x4 *)local_70);
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::getKeys
            (&this->mVpMap,&this->vp);
  bVar1 = this->useVc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"# ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," vertex positions",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    pvVar2 = (this->vp).
             super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar9 = (this->vp).
                  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"v  ",3);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).z);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," vertex positions and colors",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    pvVar2 = (this->vp).
             super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar9 = (this->vp).
                  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"v  ",3);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vp).z);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vc).r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vc).g);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)(pvVar9->vc).b);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVtMap,&this->vt);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"# ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," UV coordinates",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  paVar3 = (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar7 = (this->vt).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start; paVar7 != paVar3; paVar7 = paVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"vt ",3);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->z);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVnMap,&this->vn);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"# ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," vertex normals",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  paVar3 = (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar7 = (this->vn).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start; paVar7 != paVar3; paVar7 = paVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"vn ",3);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::ostream::_M_insert<double>((double)paVar7->z);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  pMVar11 = (this->mMeshes).
            super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->mMeshes).
             super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar11 != local_80) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"# Mesh \'",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,(pMVar11->name)._M_dataplus._M_p,
                          (pMVar11->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' with ",7);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," faces",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      if ((pMVar11->name)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"g ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,(pMVar11->name)._M_dataplus._M_p,
                            (pMVar11->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      if ((char)local_84 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"usemtl ",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,(pMVar11->matname)._M_dataplus._M_p,
                            (pMVar11->matname)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      pFVar4 = (pMVar11->faces).
               super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_78 = pMVar11;
      for (pFVar8 = (pMVar11->faces).
                    super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
                    ._M_impl.super__Vector_impl_data._M_start; pFVar8 != pFVar4; pFVar8 = pFVar8 + 1
          ) {
        local_85 = pFVar8->kind;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_85,1);
        local_85 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_85,1);
        pFVar5 = (pFVar8->indices).
                 super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar10 = (pFVar8->indices).
                       super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar10 != pFVar5;
            pFVar10 = pFVar10 + 1) {
          local_85 = ' ';
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_85,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          if (pFVar8->kind != 'p') {
            if ((pFVar8->kind == 'f') || (pFVar10->vt != 0)) {
              local_85 = '/';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_85,1);
              if (pFVar10->vt != 0) {
                std::ostream::_M_insert<unsigned_long>((ulong)this);
              }
            }
            if ((pFVar8->kind == 'f') && (pFVar10->vn != 0)) {
              local_85 = '/';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)this,&local_85,1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            }
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      pMVar11 = local_78 + 1;
    } while (pMVar11 != local_80);
  }
  return;
}

Assistant:

void ObjExporter::WriteGeometryFile(bool noMtl) {
    WriteHeader(mOutput);
    if (!noMtl)
        mOutput << "mtllib "  << GetMaterialLibName() << endl << endl;

    // collect mesh geometry
    aiMatrix4x4 mBase;
    AddNode(pScene->mRootNode, mBase);

    // write vertex positions with colors, if any
    mVpMap.getKeys( vp );
    if ( !useVc ) {
        mOutput << "# " << vp.size() << " vertex positions" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << endl;
        }
    } else {
        mOutput << "# " << vp.size() << " vertex positions and colors" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << " " << v.vc.r << " " << v.vc.g << " " << v.vc.b << endl;
        }
    }
    mOutput << endl;

    // write uv coordinates
    mVtMap.getKeys(vt);
    mOutput << "# " << vt.size() << " UV coordinates" << endl;
    for(const aiVector3D& v : vt) {
        mOutput << "vt " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // write vertex normals
    mVnMap.getKeys(vn);
    mOutput << "# " << vn.size() << " vertex normals" << endl;
    for(const aiVector3D& v : vn) {
        mOutput << "vn " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // now write all mesh instances
    for(const MeshInstance& m : mMeshes) {
        mOutput << "# Mesh \'" << m.name << "\' with " << m.faces.size() << " faces" << endl;
        if (!m.name.empty()) {
            mOutput << "g " << m.name << endl;
        }
        if ( !noMtl ) {
            mOutput << "usemtl " << m.matname << endl;
        }

        for(const Face& f : m.faces) {
            mOutput << f.kind << ' ';
            for(const FaceVertex& fv : f.indices) {
                mOutput << ' ' << fv.vp;

                if (f.kind != 'p') {
                    if (fv.vt || f.kind == 'f') {
                        mOutput << '/';
                    }
                    if (fv.vt) {
                        mOutput << fv.vt;
                    }
                    if (f.kind == 'f' && fv.vn) {
                        mOutput << '/' << fv.vn;
                    }
                }
            }

            mOutput << endl;
        }
        mOutput << endl;
    }
}